

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmArrayIndex(ExpressionContext *ctx,VmModule *module,ExprArrayIndex *node)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  SynBase *source;
  VmValue *pVVar3;
  VmValue *index;
  VmConstant *pVVar4;
  TypeRef *pTVar5;
  VmInstruction *value;
  VmConstant *elementSize;
  VmType type;
  VmModule *module_00;
  
  pVVar3 = CompileVm(ctx,module,node->value);
  index = CompileVm(ctx,module,node->index);
  pTVar1 = node->value->type;
  if (pTVar1 != (TypeBase *)0x0) {
    if (pTVar1->typeID == 0x14) {
      pVVar4 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                 *(int *)(*(long *)&pTVar1[1].typeIndex + 0x30));
      module_00 = (VmModule *)(node->super_ExprBase).source;
      pTVar5 = ExpressionContext::GetReferenceType(ctx,*(TypeBase **)&pTVar1[1].typeIndex);
      if ((pVVar3->type).type != VM_TYPE_ARRAY_REF) {
        __assert_fail("value->type.type == VM_TYPE_ARRAY_REF",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x217,
                      "VmValue *(anonymous namespace)::CreateIndexUnsized(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                     );
      }
      if (((pVVar4->super_VmValue).type.type != VM_TYPE_INT) ||
         ((pVVar4->super_VmValue).type.size != 4)) {
        __assert_fail("elementSize->type == VmType::Int",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x218,
                      "VmValue *(anonymous namespace)::CreateIndexUnsized(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                     );
      }
      if (((index->type).type != VM_TYPE_INT) || ((index->type).size != 4)) {
        __assert_fail("index->type == VmType::Int",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x219,
                      "VmValue *(anonymous namespace)::CreateIndexUnsized(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                     );
      }
      if (pTVar5 == (TypeRef *)0x0) {
        __assert_fail("structType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                      ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
      }
      type.structType = (TypeBase *)0x17;
      type._0_8_ = pTVar5;
      value = anon_unknown.dwarf_22bf96::CreateInstruction
                        ((anon_unknown_dwarf_22bf96 *)module,module_00,(SynBase *)0x800000006,type,
                         (VmInstructionType)pVVar4,pVVar3,index,(VmValue *)0x0,(VmValue *)0x0,
                         (VmValue *)module_00);
    }
    else {
      if (pTVar1->typeID != 0x12) goto LAB_00276fb0;
      pp_Var2 = pTVar1[1]._vptr_TypeBase;
      if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
        __assert_fail("arrayType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xd0c,
                      "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                     );
      }
      if (*(int *)(pp_Var2[0xc] + 0x34) != 0) {
        __assert_fail("unsigned(arrayType->subType->size) == arrayType->subType->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xd0d,
                      "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                     );
      }
      pVVar4 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                 *(int *)(pp_Var2 + 0xd));
      elementSize = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                      *(int *)(pp_Var2[0xc] + 0x30));
      source = (node->super_ExprBase).source;
      pTVar5 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pp_Var2[0xc]);
      value = (VmInstruction *)
              anon_unknown.dwarf_22bf96::CreateIndex
                        (module,source,&pVVar4->super_VmValue,&elementSize->super_VmValue,pVVar3,
                         index,&pTVar5->super_TypeBase);
    }
    pVVar3 = anon_unknown.dwarf_22bf96::CheckType
                       (ctx,(ExprBase *)(node->super_ExprBase).type,&value->super_VmValue);
    return pVVar3;
  }
LAB_00276fb0:
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xd08,
                "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)");
}

Assistant:

VmValue* CompileVmArrayIndex(ExpressionContext &ctx, VmModule *module, ExprArrayIndex *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);
	VmValue *index = CompileVm(ctx, module, node->index);

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(node->value->type))
	{
		VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->subType->size));

		return CheckType(ctx, node, CreateIndexUnsized(module, node->source, elementSize, value, index, ctx.GetReferenceType(arrayType->subType)));
	}

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);
	assert(unsigned(arrayType->subType->size) == arrayType->subType->size);

	VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->length));
	VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->subType->size));

	return CheckType(ctx, node, CreateIndex(module, node->source, arrayLength, elementSize, value, index, ctx.GetReferenceType(arrayType->subType)));
}